

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atkdp.cpp
# Opt level: O1

void anothersearch(int bomberNum,int bomberID,_func_void_BelongStructure_ptr_float_int_ptr *func)

{
  uint uVar1;
  size_t __n;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  float fVar9;
  
  lVar3 = (long)usedGrid[0];
  lVar4 = (long)usedGrid[1];
  lVar6 = (long)usedGrid[2];
  lVar7 = (long)usedGrid[3];
  fVar9 = formularAllShipAtk(shipAtk);
  (*func)(dpRes[lVar3][lVar4][lVar6] + lVar7,fVar9,belonging);
  if (bomberNum != 0) {
    iVar8 = 0;
    if (0 < bomberID) {
      uVar1 = bomberID - 1;
      __n = planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
            super__Vector_impl_data._M_start[(uint)bomberID].name._M_string_length;
      iVar8 = 0;
      if ((__n == planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar1].name._M_string_length) &&
         ((__n == 0 ||
          (iVar2 = bcmp(planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                        super__Vector_impl_data._M_start[(uint)bomberID].name._M_dataplus._M_p,
                        planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar1].name._M_dataplus._M_p,__n),
          iVar2 == 0)))) {
        iVar8 = belonging[uVar1];
      }
    }
    if (iVar8 < carrierNum) {
      iVar5 = planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
              super__Vector_impl_data._M_start[bomberID].bombAtk * 0xd +
              planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
              super__Vector_impl_data._M_start[bomberID].torpedoAtk * 10;
      iVar2 = planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
              super__Vector_impl_data._M_start[bomberID].accuracy;
      lVar3 = (long)iVar8;
      do {
        if (usedGrid[lVar3] < availGrid[lVar3]) {
          shipAtk[lVar3] = shipAtk[lVar3] + iVar5;
          shipAccu[lVar3] = shipAccu[lVar3] + iVar2;
          usedGrid[lVar3] = usedGrid[lVar3] + 1;
          belonging[bomberID] = (int)lVar3;
          anothersearch(bomberNum + -1,bomberID + 1,func);
          usedGrid[lVar3] = usedGrid[lVar3] + -1;
          shipAccu[lVar3] = shipAccu[lVar3] - iVar2;
          shipAtk[lVar3] = shipAtk[lVar3] - iVar5;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < carrierNum);
    }
    return;
  }
  return;
}

Assistant:

void anothersearch(int bomberNum,int bomberID,void(* func)(BelongStructure *,float ,int *)){
    func(&dpRes[usedGrid[0]][usedGrid[1]][usedGrid[2]][usedGrid[3]],formularAllShipAtk(shipAtk),belonging);
    if(bomberNum == 0){//��������
        return;
    }

    int i=0;
    //���������������ظ���
    if(bomberID > 0 && planeVecA[bomberID].name == planeVecA[bomberID - 1].name)
        i = belonging[bomberID - 1];
    Plane &tplane = planeVecA[bomberID];
    int tdamage = formulaDamage(tplane), taccu = tplane.accuracy;
    for(; i < carrierNum; i++){
        if(usedGrid[i]<availGrid[i]){
            shipAtk[i] += tdamage;
            shipAccu[i] += taccu;
            usedGrid[i] ++ ;
            belonging[bomberID] = i;
            anothersearch(bomberNum - 1,bomberID + 1,func);
            usedGrid[i] -- ;
            shipAccu[i] -= taccu;
            shipAtk[i] -= tdamage;
        }
    }
}